

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O2

void __thiscall p2t::SweepContext::InitTriangulation(SweepContext *this)

{
  __normal_iterator<p2t::Point_**,_std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_>
  __first;
  __normal_iterator<p2t::Point_**,_std::vector<p2t::Point_*,_std::allocator<p2t::Point_*>_>_> __last
  ;
  undefined1 auVar1 [16];
  Point *pPVar2;
  uint uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  
  __first._M_current =
       (this->points_).super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->points_).super__Vector_base<p2t::Point_*,_std::allocator<p2t::Point_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  dVar4 = (*__first._M_current)->x;
  dVar6 = (*__first._M_current)->y;
  dVar7 = dVar4;
  dVar10 = dVar6;
  for (uVar3 = 0; (ulong)uVar3 < (ulong)((long)__last._M_current - (long)__first._M_current >> 3);
      uVar3 = uVar3 + 1) {
    auVar5._0_8_ = __first._M_current[uVar3]->x;
    auVar5._8_8_ = __first._M_current[uVar3]->y;
    auVar9._8_8_ = dVar10;
    auVar9._0_8_ = dVar7;
    auVar9 = maxpd(auVar5,auVar9);
    auVar1._8_8_ = dVar6;
    auVar1._0_8_ = dVar4;
    auVar5 = minpd(auVar5,auVar1);
    dVar7 = auVar9._0_8_;
    dVar10 = auVar9._8_8_;
    dVar4 = auVar5._0_8_;
    dVar6 = auVar5._8_8_;
  }
  pPVar2 = (Point *)operator_new(0x28);
  dVar8 = (dVar7 - dVar4) * 0.3;
  dVar6 = dVar6 - (dVar10 - dVar6) * 0.3;
  pPVar2->x = dVar7 + dVar8;
  pPVar2->y = dVar6;
  (pPVar2->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar2->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar2->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->head_ = pPVar2;
  pPVar2 = (Point *)operator_new(0x28);
  pPVar2->x = dVar4 - dVar8;
  pPVar2->y = dVar6;
  (pPVar2->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pPVar2->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pPVar2->edge_list).super__Vector_base<p2t::Edge_*,_std::allocator<p2t::Edge_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->tail_ = pPVar2;
  std::
  __sort<__gnu_cxx::__normal_iterator<p2t::Point**,std::vector<p2t::Point*,std::allocator<p2t::Point*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(p2t::Point_const*,p2t::Point_const*)>>
            (__first,__last,
             (_Iter_comp_iter<bool_(*)(const_p2t::Point_*,_const_p2t::Point_*)>)0x524dcd);
  return;
}

Assistant:

void SweepContext::InitTriangulation()
{
  double xmax(points_[0]->x), xmin(points_[0]->x);
  double ymax(points_[0]->y), ymin(points_[0]->y);

  // Calculate bounds.
  for (unsigned int i = 0; i < points_.size(); i++) {
    Point& p = *points_[i];
    if (p.x > xmax)
      xmax = p.x;
    if (p.x < xmin)
      xmin = p.x;
    if (p.y > ymax)
      ymax = p.y;
    if (p.y < ymin)
      ymin = p.y;
  }

  double dx = kAlpha * (xmax - xmin);
  double dy = kAlpha * (ymax - ymin);
  head_ = new Point(xmax + dx, ymin - dy);
  tail_ = new Point(xmin - dx, ymin - dy);

  // Sort points along y-axis
  std::sort(points_.begin(), points_.end(), cmp);

}